

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_zoh.c
# Opt level: O1

SRC_STATE * zoh_copy(SRC_STATE *state)

{
  undefined8 *puVar1;
  SRC_STATE_VT *pSVar2;
  double dVar3;
  double dVar4;
  undefined8 uVar5;
  SRC_STATE *__ptr;
  SRC_STATE *pSVar6;
  src_callback_t p_Var7;
  long lVar8;
  SRC_STATE *pSVar9;
  size_t __size;
  byte bVar10;
  
  bVar10 = 0;
  if (state == (SRC_STATE *)0x0) {
    __assert_fail("state != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_zoh.c"
                  ,0xee,"SRC_STATE *zoh_copy(SRC_STATE *)");
  }
  puVar1 = (undefined8 *)state->private_data;
  if ((puVar1 != (undefined8 *)0x0) &&
     (__ptr = (SRC_STATE *)calloc(1,0x50), __ptr != (SRC_STATE *)0x0)) {
    pSVar6 = state;
    pSVar9 = __ptr;
    for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
      pSVar9->vt = pSVar6->vt;
      pSVar6 = (SRC_STATE *)((long)pSVar6 + (ulong)bVar10 * -0x10 + 8);
      pSVar9 = (SRC_STATE *)((long)pSVar9 + (ulong)bVar10 * -0x10 + 8);
    }
    pSVar6 = (SRC_STATE *)calloc(1,0x30);
    if (pSVar6 != (SRC_STATE *)0x0) {
      pSVar2 = (SRC_STATE_VT *)*puVar1;
      dVar3 = (double)puVar1[1];
      dVar4 = (double)puVar1[2];
      uVar5 = puVar1[3];
      p_Var7 = (src_callback_t)puVar1[5];
      *(undefined8 *)&pSVar6->mode = puVar1[4];
      pSVar6->callback_func = p_Var7;
      pSVar6->last_position = dVar4;
      pSVar6->error = (int)uVar5;
      pSVar6->channels = (int)((ulong)uVar5 >> 0x20);
      pSVar6->vt = pSVar2;
      pSVar6->last_ratio = dVar3;
      __size = (long)state->channels << 2;
      p_Var7 = (src_callback_t)malloc(__size);
      pSVar6->callback_func = p_Var7;
      if (p_Var7 != (src_callback_t)0x0) {
        memcpy(p_Var7,(void *)puVar1[5],__size);
        __ptr->private_data = pSVar6;
        return __ptr;
      }
      free(__ptr);
      __ptr = pSVar6;
    }
    free(__ptr);
  }
  return (SRC_STATE *)0x0;
}

Assistant:

static SRC_STATE *
zoh_copy (SRC_STATE *state)
{
	assert (state != NULL) ;

	if (state->private_data == NULL)
		return NULL ;

	SRC_STATE *to = (SRC_STATE *) calloc (1, sizeof (SRC_STATE)) ;
	if (!to)
		return NULL ;
	memcpy (to, state, sizeof (SRC_STATE)) ;

	ZOH_DATA* from_priv = (ZOH_DATA*) state->private_data ;
	ZOH_DATA *to_priv = (ZOH_DATA *) calloc (1, sizeof (ZOH_DATA)) ;
	if (!to_priv)
	{
		free (to) ;
		return NULL ;
	}

	memcpy (to_priv, from_priv, sizeof (ZOH_DATA)) ;
	to_priv->last_value = (float *) malloc (sizeof (float) * state->channels) ;
	if (!to_priv->last_value)
	{
		free (to) ;
		free (to_priv) ;
		return NULL ;
	}
	memcpy (to_priv->last_value, from_priv->last_value, sizeof (float) * state->channels) ;

	to->private_data = to_priv ;

	return to ;
}